

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

torrent_handle __thiscall libtorrent::aux::torrent::get_handle(torrent *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  torrent_handle tVar1;
  enable_shared_from_this<libtorrent::aux::torrent> local_38;
  weak_ptr<libtorrent::aux::torrent> local_28;
  torrent *this_local;
  
  this_local = this;
  ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_38);
  ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
            (&local_28,(shared_ptr<libtorrent::aux::torrent> *)&local_38);
  torrent_handle::torrent_handle((torrent_handle *)this,&local_28);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr(&local_28);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)&local_38);
  tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (torrent_handle)
         tVar1.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

torrent_handle torrent::get_handle()
	{
		TORRENT_ASSERT(is_single_thread());
		return torrent_handle(shared_from_this());
	}